

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O2

String * __thiscall
kj::
str<char_const*const&,char_const(&)[2],unsigned_int_const&,char_const(&)[2],unsigned_int_const&,char_const(&)[5],char_const*const&>
          (String *__return_storage_ptr__,kj *this,char **params,char (*params_1) [2],uint *params_2
          ,char (*params_3) [2],uint *params_4,char (*params_5) [5],char **params_6)

{
  ArrayPtr<const_char> *in_stack_ffffffffffffff48;
  CappedArray<char,_14UL> local_b0;
  ArrayPtr<const_char> local_98;
  ArrayPtr<const_char> local_88;
  ArrayPtr<const_char> local_78;
  ArrayPtr<const_char> local_68;
  ArrayPtr<const_char> local_58;
  CappedArray<char,_14UL> local_48;
  
  local_58 = toCharSequence<char_const*const&>((char **)this);
  local_68 = toCharSequence<char_const(&)[2]>((char (*) [2])params);
  toCharSequence<unsigned_int_const&>(&local_b0,(kj *)params_1,(uint *)local_68.size_);
  local_78 = toCharSequence<char_const(&)[2]>((char (*) [2])params_2);
  toCharSequence<unsigned_int_const&>(&local_48,(kj *)params_3,(uint *)local_78.size_);
  local_88 = toCharSequence<char_const(&)[5]>((char (*) [5])params_4);
  local_98 = toCharSequence<char_const*const&>((char **)params_5);
  _::
  concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(_ *)&local_58,&local_68,(ArrayPtr<const_char> *)&local_b0,
             (CappedArray<char,_14UL> *)&local_78,(ArrayPtr<const_char> *)&local_48,
             (CappedArray<char,_14UL> *)&local_88,&local_98,in_stack_ffffffffffffff48);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}